

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall embree::XMLWriter::store(XMLWriter *this,char *name,AffineSpace3fa *space)

{
  ostream *poVar1;
  void *pvVar2;
  float *in_RDX;
  char *in_RSI;
  XMLWriter *in_RDI;
  
  tab(in_RDI);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"<");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,">");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  tab(in_RDI);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RDX);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[4]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[8]);
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDX[0xc]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  tab(in_RDI);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[5]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[9]);
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDX[0xd]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  tab(in_RDI);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[2]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[6]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX[10]);
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDX[0xe]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  tab(in_RDI);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"</");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,">");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void XMLWriter::store(const char* name, const AffineSpace3fa& space)
  {
    tab(); xml << "<" << name << ">" << std::endl;
    tab(); xml << "  " << space.l.vx.x << " " << space.l.vy.x << " " << space.l.vz.x << " " << space.p.x << std::endl;
    tab(); xml << "  " << space.l.vx.y << " " << space.l.vy.y << " " << space.l.vz.y << " " << space.p.y << std::endl;
    tab(); xml << "  " << space.l.vx.z << " " << space.l.vy.z << " " << space.l.vz.z << " " << space.p.z << std::endl;
    tab(); xml << "</" << name << ">" << std::endl;
  }